

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QPointer<QMdiSubWindow>_>::move
          (QList<QPointer<QMdiSubWindow>_> *this,qsizetype from,qsizetype to)

{
  long in_RDX;
  long in_RSI;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> *in_RDI;
  QPointer<QMdiSubWindow> *unaff_retaddr;
  QPointer<QMdiSubWindow> *b;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> *__last;
  
  if (in_RSI != in_RDX) {
    __last = in_RDI;
    detach((QList<QPointer<QMdiSubWindow>_> *)0x61878a);
    QArrayDataPointer<QPointer<QMdiSubWindow>_>::operator->(in_RDI);
    QArrayDataPointer<QPointer<QMdiSubWindow>_>::begin
              ((QArrayDataPointer<QPointer<QMdiSubWindow>_> *)0x61879b);
    if (in_RSI < in_RDX) {
      std::_V2::rotate<QPointer<QMdiSubWindow>*>(b,unaff_retaddr,(QPointer<QMdiSubWindow> *)__last);
    }
    else {
      std::_V2::rotate<QPointer<QMdiSubWindow>*>(b,unaff_retaddr,(QPointer<QMdiSubWindow> *)__last);
    }
  }
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }